

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grant_message.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::price::pixie::GrantMessage::ToString_abi_cxx11_
          (string *__return_storage_ptr__,GrantMessage *this)

{
  ostream *poVar1;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  GrantMessage *local_18;
  GrantMessage *this_local;
  
  local_18 = this;
  this_local = (GrantMessage *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"Grant(granted=");
  if ((this->granted_ & 1U) == 0) {
    std::operator<<(local_190,"false");
  }
  else {
    std::operator<<(local_190,"true");
  }
  poVar1 = std::operator<<(local_190,", reason=");
  poVar1 = std::operator<<(poVar1,(string *)&this->reason_);
  std::operator<<(poVar1,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

const std::string GrantMessage::ToString()
{
    std::stringstream ss;

    ss << "Grant(granted=";

    if (granted_)
    {
        ss << "true";
    }
    else
    {
        ss << "false";
    }
    ss << ", reason=" << reason_ << ")";
    return ss.str();
}